

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldTreatmentChangeListToSet_Test
::TestBody(MessageDifferencerTest_RepeatedFieldTreatmentChangeListToSet_Test *this)

{
  RepeatedField<int> *pRVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  char *in_R9;
  string_view name;
  string_view name_00;
  AssertHelper local_370;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_368;
  string local_360;
  AssertionResult gtest_ar_;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  pRVar1 = &msg1.field_0._impl_.rv_;
  RepeatedField<int>::Add(pRVar1,1);
  RepeatedField<int>::Add(pRVar1,2);
  pRVar1 = &msg2.field_0._impl_.rv_;
  RepeatedField<int>::Add(pRVar1,2);
  RepeatedField<int>::Add(pRVar1,1);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  pDVar2 = proto2_unittest::TestDiffMessage::GetDescriptor();
  name._M_str = "rv";
  name._M_len = 2;
  pFVar3 = Descriptor::FindFieldByName(pDVar2,name);
  util::MessageDifferencer::TreatAsList(&differencer,pFVar3);
  pDVar2 = proto2_unittest::TestDiffMessage::GetDescriptor();
  name_00._M_str = "rv";
  name_00._M_len = 2;
  pFVar3 = Descriptor::FindFieldByName(pDVar2,name_00);
  util::MessageDifferencer::TreatAsSet(&differencer,pFVar3);
  gtest_ar_.success_ =
       util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_360,(internal *)&gtest_ar_,(AssertionResult *)0xf0d901,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x5e0,local_360._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&local_360);
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldTreatmentChangeListToSet) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  msg1.add_rv(1);
  msg1.add_rv(2);
  msg2.add_rv(2);
  msg2.add_rv(1);

  util::MessageDifferencer differencer;
  differencer.TreatAsList(
      proto2_unittest::TestDiffMessage::descriptor()->FindFieldByName("rv"));
  differencer.TreatAsSet(
      proto2_unittest::TestDiffMessage::descriptor()->FindFieldByName("rv"));

  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}